

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QDirSortItem>::emplace_back_impl<QFileInfo_const&,QFlags<QDir::SortFlag>&>
          (QVLABase<QDirSortItem> *this,qsizetype prealloc,void *array,QFileInfo *args,
          QFlags<QDir::SortFlag> *args_1)

{
  QFileInfo *args_00;
  QFileInfo *pQVar1;
  qsizetype in_RCX;
  QVLABase<QDirSortItem> *in_RDX;
  QVLABaseBase *in_RDI;
  void *in_R8;
  reference r;
  qsizetype in_stack_ffffffffffffffd0;
  QDirSortItem *pQVar2;
  
  args_00 = (QFileInfo *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QFileInfo *)QVLABaseBase::capacity(in_RDI);
  if (args_00 == pQVar1) {
    growBy(in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffd0);
  }
  pQVar2 = (QDirSortItem *)&DAT_aaaaaaaaaaaaaaaa;
  end((QVLABase<QDirSortItem> *)in_RDI);
  pQVar2 = q20::construct_at<QDirSortItem,QFileInfo_const&,QFlags<QDir::SortFlag>&,void>
                     (pQVar2,args_00,(QFlags<QDir::SortFlag> *)in_RDI);
  in_RDI->s = in_RDI->s + 1;
  return pQVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }